

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlPatternMatch(xmlPatternPtr comp,xmlNodePtr node)

{
  xmlPatOp xVar1;
  xmlStepOpPtr pxVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  void *pvVar7;
  xmlNodePtr pxVar8;
  uint uVar9;
  xmlStepOpPtr pxVar10;
  ulong uVar11;
  xmlChar *str2;
  xmlChar *pxVar12;
  void *pvVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  _xmlNode *p_Var17;
  
  if (node == (xmlNodePtr)0x0 || comp == (xmlPatternPtr)0x0) {
LAB_001719bd:
    iVar16 = -1;
  }
  else {
    do {
      if (comp->nbStep < 1) {
        return 1;
      }
      uVar15 = 0;
      uVar6 = 0;
      pvVar13 = (void *)0x0;
      iVar16 = 0;
      pxVar8 = node;
LAB_001719fb:
      pxVar2 = comp->steps;
      if (XML_OP_ALL < pxVar2[iVar16].op) goto LAB_00171da9;
      pxVar10 = pxVar2 + iVar16;
      iVar14 = (int)uVar15;
      switch(pxVar2[iVar16].op) {
      case XML_OP_END:
        goto switchD_00171a1e_caseD_0;
      case XML_OP_ROOT:
        if ((pxVar8->type != XML_NAMESPACE_DECL) &&
           (pxVar8 = pxVar8->parent,
           (pxVar8->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE)) goto LAB_00171da9;
        break;
      case XML_OP_ELEM:
        if (pxVar8->type == XML_ELEMENT_NODE) {
LAB_00171b42:
          pxVar12 = pxVar10->value;
          if (pxVar12 != (xmlChar *)0x0) {
            if ((*pxVar12 != *pxVar8->name) ||
               (iVar4 = xmlStrEqual(pxVar12,pxVar8->name), iVar4 == 0)) break;
            if (pxVar8->ns == (xmlNs *)0x0) {
              if (pxVar10->value2 != (xmlChar *)0x0) break;
            }
            else {
              str2 = pxVar8->ns->href;
              if (str2 != (xmlChar *)0x0) {
                pxVar12 = pxVar10->value2;
                goto LAB_00171b94;
              }
            }
          }
          goto LAB_00171da9;
        }
        break;
      case XML_OP_CHILD:
        if (((pxVar8->type < XML_DTD_NODE) &&
            ((0x2202U >> (pxVar8->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
           (pxVar10->value != (xmlChar *)0x0)) {
          for (p_Var17 = pxVar8->children; p_Var17 != (_xmlNode *)0x0; p_Var17 = p_Var17->next) {
            if (p_Var17->type == XML_ELEMENT_NODE) {
              if ((*pxVar10->value == *p_Var17->name) &&
                 (iVar4 = xmlStrEqual(pxVar10->value,p_Var17->name), iVar4 != 0)) goto LAB_00171da9;
            }
          }
        }
        break;
      case XML_OP_ATTR:
        if ((pxVar8->type == XML_ATTRIBUTE_NODE) &&
           ((pxVar12 = pxVar10->value, pxVar12 == (xmlChar *)0x0 ||
            ((*pxVar12 == *pxVar8->name && (iVar4 = xmlStrEqual(pxVar12,pxVar8->name), iVar4 != 0)))
            ))) {
          pxVar12 = pxVar10->value2;
          if (pxVar8->ns != (xmlNs *)0x0) {
            if (pxVar12 == (xmlChar *)0x0) goto LAB_00171da9;
            str2 = pxVar8->ns->href;
            goto LAB_00171bf6;
          }
joined_r0x00171c19:
          if (pxVar12 == (xmlChar *)0x0) goto LAB_00171da9;
        }
        break;
      case XML_OP_PARENT:
        if (((XML_NAMESPACE_DECL < pxVar8->type) ||
            ((0x42200U >> (pxVar8->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
           (pxVar8 = pxVar8->parent, pxVar8 != (xmlNodePtr)0x0)) goto LAB_00171b42;
        break;
      case XML_OP_ANCESTOR:
        if (pxVar10->value == (xmlChar *)0x0) {
          iVar16 = iVar16 + 1;
          if (pxVar2[iVar16].op != XML_OP_ELEM) {
            if (pxVar2[iVar16].op != XML_OP_ROOT) break;
            goto switchD_00171a1e_caseD_0;
          }
          pxVar10 = pxVar2 + iVar16;
          if (pxVar10->value == (xmlChar *)0x0) goto LAB_001719bd;
        }
        if ((pxVar8 != (xmlNodePtr)0x0) &&
           ((XML_NAMESPACE_DECL < pxVar8->type ||
            ((0x42200U >> (pxVar8->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
          do {
            while( true ) {
              do {
                do {
                  pxVar8 = pxVar8->parent;
                  if (pxVar8 == (xmlNodePtr)0x0) goto LAB_00171cd4;
                } while (pxVar8->type != XML_ELEMENT_NODE);
              } while ((*pxVar10->value != *pxVar8->name) ||
                      (iVar4 = xmlStrEqual(pxVar10->value,pxVar8->name), iVar4 == 0));
              if (pxVar8->ns == (xmlNs *)0x0) break;
              pxVar12 = pxVar8->ns->href;
              if (((pxVar12 != (xmlChar *)0x0) && (pxVar10->value2 != (xmlChar *)0x0)) &&
                 (iVar4 = xmlStrEqual(pxVar10->value2,pxVar12), iVar4 != 0)) goto LAB_00171d08;
            }
          } while (pxVar10->value2 != (xmlChar *)0x0);
LAB_00171d08:
          xVar1 = pxVar10->op;
          uVar5 = (uint)uVar6;
          pvVar7 = pvVar13;
          uVar11 = uVar6;
          if ((int)uVar5 <= iVar14) {
            if ((int)uVar5 < 1) {
              uVar11 = 4;
            }
            else {
              if (999999999 < uVar5) goto LAB_00171da9;
              uVar9 = uVar5 + 1 >> 1;
              uVar3 = uVar9 + uVar5;
              if (1000000000 - uVar9 < uVar5) {
                uVar3 = 1000000000;
              }
              uVar11 = (ulong)uVar3;
            }
            pvVar7 = (*xmlRealloc)(pvVar13,uVar11 << 4);
            if (pvVar7 == (void *)0x0) goto LAB_00171da9;
          }
          uVar6 = uVar11;
          *(uint *)((long)pvVar7 + (long)iVar14 * 0x10) = iVar16 - (uint)(xVar1 != XML_OP_ANCESTOR);
          uVar15 = (ulong)(iVar14 + 1);
          *(xmlNodePtr *)((long)pvVar7 + (long)iVar14 * 0x10 + 8) = pxVar8;
          pvVar13 = pvVar7;
          goto LAB_00171da9;
        }
        break;
      case XML_OP_NS:
        if (pxVar8->type == XML_ELEMENT_NODE) {
          if (pxVar8->ns == (xmlNs *)0x0) {
            pxVar12 = pxVar10->value;
            goto joined_r0x00171c19;
          }
          str2 = pxVar8->ns->href;
          if (str2 == (xmlChar *)0x0) goto LAB_00171da9;
          pxVar12 = pxVar10->value;
LAB_00171b94:
          if (pxVar12 != (xmlChar *)0x0) {
LAB_00171bf6:
            iVar4 = xmlStrEqual(pxVar12,str2);
            if (iVar4 != 0) goto LAB_00171da9;
          }
        }
        break;
      case XML_OP_ALL:
        if (pxVar8->type == XML_ELEMENT_NODE) goto LAB_00171da9;
      }
LAB_00171cd4:
      if (pvVar13 == (void *)0x0) goto LAB_00171dd0;
      if (0 < iVar14) {
        uVar15 = (ulong)(iVar14 - 1);
        iVar16 = *(int *)((long)pvVar13 + uVar15 * 0x10);
        pxVar8 = *(xmlNodePtr *)((long)pvVar13 + uVar15 * 0x10 + 8);
        if (comp->nbStep <= iVar16) goto LAB_00171de6;
        goto LAB_001719fb;
      }
      (*xmlFree)(pvVar13);
LAB_00171dd0:
      comp = comp->next;
    } while (comp != (_xmlPattern *)0x0);
    iVar16 = 0;
  }
  return iVar16;
LAB_00171da9:
  iVar16 = iVar16 + 1;
  if (comp->nbStep <= iVar16) {
switchD_00171a1e_caseD_0:
    if (pvVar13 != (void *)0x0) {
LAB_00171de6:
      (*xmlFree)(pvVar13);
    }
    return 1;
  }
  goto LAB_001719fb;
}

Assistant:

int
xmlPatternMatch(xmlPatternPtr comp, xmlNodePtr node)
{
    int ret = 0;

    if ((comp == NULL) || (node == NULL))
        return(-1);

    while (comp != NULL) {
        ret = xmlPatMatch(comp, node);
	if (ret != 0)
	    return(ret);
	comp = comp->next;
    }
    return(ret);
}